

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

BigInt * __thiscall BigInt::simple_multiply(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  allocator_type local_99;
  vector<int,_std::allocator<int>_> temp;
  BigInt local_70;
  string local_50;
  
  BigInt((BigInt *)&temp,0);
  bVar8 = operator==(this,(BigInt *)&temp);
  if (bVar8) {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&temp.super__Vector_base<int,_std::allocator<int>_>);
  }
  else {
    BigInt(&local_70,0);
    bVar8 = operator==(b,&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&temp.super__Vector_base<int,_std::allocator<int>_>);
    if (!bVar8) {
      iVar9 = get_real_length(this);
      uVar10 = get_real_length(b);
      iVar2 = uVar10 + iVar9;
      local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&temp,(long)iVar2,(value_type_conflict2 *)&local_70,&local_99);
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      iVar3 = this->sign;
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      iVar4 = b->sign;
      lVar12 = 4;
      for (uVar11 = 1; uVar11 != iVar9 + 1; uVar11 = uVar11 + 1) {
        piVar6 = (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7 = (b->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar13 = 0; uVar10 != uVar13; uVar13 = uVar13 + 1) {
          piVar1 = (int *)((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start + uVar13 * 4 + lVar12);
          *piVar1 = *piVar1 + piVar7[uVar13 + 1] * piVar6[uVar11];
        }
        lVar12 = lVar12 + 4;
      }
      uVar11 = 1;
      for (iVar9 = 0; ((long)uVar11 < (long)iVar2 || (iVar9 != 0)); iVar9 = (iVar9 + iVar5) / 10) {
        if ((ulong)((long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar11) {
          local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&temp,(int *)&local_70);
        }
        iVar5 = temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar11];
        temp.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [uVar11] = (iVar9 + iVar5) % 10;
        uVar11 = uVar11 + 1;
      }
      std::__cxx11::string::string((string *)&local_50,"0",(allocator *)&local_70);
      BigInt(__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::vector<int,_std::allocator<int>_>::operator=(&__return_storage_ptr__->value,&temp);
      get_real_length(__return_storage_ptr__);
      uVar10 = (uint)((iVar3 == 0) != (iVar4 == 0));
      __return_storage_ptr__->sign = uVar10;
      *(__return_storage_ptr__->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start = uVar10;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&temp.super__Vector_base<int,_std::allocator<int>_>);
      return __return_storage_ptr__;
    }
  }
  BigInt(__return_storage_ptr__,0);
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::simple_multiply(BigInt& b) {
    if (*this == 0 || b == 0) {
        return BigInt(0);
    }
    int len_a = this->get_real_length();
    int len_b = b.get_real_length();
    vector<int> temp(len_a + len_b, 0);
    bool positive = this->get_positive_sign() == b.get_positive_sign() ? true : false;
    int carry = 0;
    int i, j;
    for (i = 1; i <= len_a; ++i) { // not carry first
        for (j = 1; j <= len_b; ++j) {
            temp[i + j - 1] += this->value[i] * b.value[j];
        }
    }
    i = 1;
    j = 0;
    while (i < (len_a + len_b) || carry != 0) { // calculate carry
        if (i >= temp.size()) {
            temp.push_back(0);
        }
        j = temp[i] + carry;
        temp[i] = j % 10;
        carry = j / 10;
        ++i;
    }
    BigInt ans("0");
    ans.value = temp;
    ans.get_real_length();
    ans.set_sign(positive);
    return ans;
}